

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptListIterator.cpp
# Opt level: O0

void __thiscall
Js::JavascriptListIterator::JavascriptListIterator
          (JavascriptListIterator *this,DynamicType *type,ListForListIterator *list)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  Type TVar4;
  undefined4 *puVar5;
  ListForListIterator *list_local;
  DynamicType *type_local;
  JavascriptListIterator *this_local;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01df93f8;
  Memory::
  WriteBarrierPtr<JsUtil::List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::WriteBarrierPtr(&this->listForIterator,list);
  this->index = 0;
  TVar3 = Js::Type::GetTypeId(&type->super_Type);
  if (TVar3 != TypeIds_ListIterator) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptListIterator.cpp"
                                ,0xe,"(type->GetTypeId() == TypeIds_ListIterator)",
                                "type->GetTypeId() == TypeIds_ListIterator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  TVar4 = JsUtil::ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>::Count
                    (&list->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>);
  this->count = TVar4;
  return;
}

Assistant:

JavascriptListIterator::JavascriptListIterator(DynamicType* type, ListForListIterator* list) :
        DynamicObject(type),
        listForIterator(list),
        index(0)
    {
        Assert(type->GetTypeId() == TypeIds_ListIterator);
        count = list->Count();
    }